

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

bool __thiscall QTreeModel::insertRows(QTreeModel *this,int row,int count,QModelIndex *parent)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  QTreeWidgetItem *pQVar4;
  QTreeWidgetItem *this_00;
  QTreeWidget *pQVar5;
  QTreeModel *this_01;
  QTreeWidgetItem *pQVar6;
  ulong i;
  
  bVar1 = this->skipPendingSort;
  this->skipPendingSort = true;
  if (row < 0 || count < 1) {
    bVar2 = false;
  }
  else {
    iVar3 = (**(code **)(*(long *)this + 0x78))(this,parent);
    bVar2 = false;
    if ((row <= iVar3) && (parent->c < 1)) {
      this_01 = this;
      QAbstractItemModel::beginInsertRows((QModelIndex *)this,(int)parent,row);
      pQVar4 = item(this_01,parent);
      i = (ulong)(uint)row;
      for (; 0 < count; count = count + -1) {
        this_00 = (QTreeWidgetItem *)operator_new(0x60);
        QTreeWidgetItem::QTreeWidgetItem(this_00,0);
        pQVar5 = view(this);
        this_00->view = pQVar5;
        this_00->par = pQVar4;
        pQVar6 = pQVar4;
        if (pQVar4 == (QTreeWidgetItem *)0x0) {
          pQVar6 = this->rootItem;
        }
        QList<QTreeWidgetItem_*>::insert(&pQVar6->children,i,this_00);
        i = i + 1;
      }
      QAbstractItemModel::endInsertRows();
      bVar2 = true;
    }
  }
  this->skipPendingSort = bVar1;
  return bVar2;
}

Assistant:

bool QTreeModel::insertRows(int row, int count, const QModelIndex &parent)
{
    SkipSorting skipSorting(this);
    if (count < 1 || row < 0 || row > rowCount(parent) || parent.column() > 0)
        return false;

    beginInsertRows(parent, row, row + count - 1);
    QTreeWidgetItem *par = item(parent);
    while (count > 0) {
        QTreeWidgetItem *item = new QTreeWidgetItem();
        item->view = view();
        item->par = par;
        if (par)
            par->children.insert(row++, item);
        else
            rootItem->children.insert(row++, item);
        --count;
    }
    endInsertRows();
    return true;
}